

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O3

void __thiscall jsonnet::internal::anon_unknown_0::HeapString::~HeapString(HeapString *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapString_00239750;
  pcVar2 = (this->value)._M_dataplus._M_p;
  paVar1 = &(this->value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity * 4 + 4);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

HeapString(const UString &value) : HeapEntity(STRING), value(value) {}